

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteWatchdogPeriodInSeconds(AmpIO *this,double seconds,bool ledDisplay)

{
  bool bVar1;
  uint *puVar2;
  uint local_24;
  uint local_20;
  byte local_19;
  uint32_t counts;
  bool ledDisplay_local;
  double seconds_local;
  AmpIO *this_local;
  
  local_19 = ledDisplay;
  _counts = seconds;
  seconds_local = (double)this;
  if ((seconds != 0.0) || (NAN(seconds))) {
    local_20 = (uint)(long)(seconds / 5.208333333333333e-06);
    local_24 = 1;
    puVar2 = std::max<unsigned_int>(&local_20,&local_24);
    local_20 = *puVar2;
  }
  else {
    local_20 = 0;
  }
  if ((local_19 & 1) != 0) {
    local_20 = local_20 | 0x80000000;
  }
  bVar1 = WriteWatchdogPeriod(this,local_20);
  return bVar1;
}

Assistant:

bool AmpIO::WriteWatchdogPeriodInSeconds(const double seconds, bool ledDisplay)
{
    uint32_t counts;
    if (seconds == 0.0) {
        // Disable watchdog
        counts = 0;
    } else {
        // Use at least one tick just to make sure we don't accidentaly disable;
        // the truth is that the count will be so low that watchdog will
        // continuously trigger.
        counts = static_cast<uint32_t>(seconds/WDOG_ClockPeriod);
        counts = std::max(counts, static_cast<uint32_t>(1));
    }
    if (ledDisplay)
        counts |= 0x80000000;
    return WriteWatchdogPeriod(counts);
}